

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_vector.cpp
# Opt level: O0

ostream * spvtools::utils::operator<<(ostream *out,BitVector *bv)

{
  size_type sVar1;
  const_reference pvVar2;
  ostream *this;
  int local_2c;
  value_type vStack_28;
  uint32_t j;
  BitContainer b;
  uint32_t i;
  BitVector *bv_local;
  ostream *out_local;
  
  std::operator<<(out,"{");
  b._4_4_ = 0;
  while( true ) {
    sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&bv->bits_);
    if (sVar1 <= b._4_4_) break;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&bv->bits_,(ulong)b._4_4_);
    vStack_28 = *pvVar2;
    local_2c = 0;
    for (; vStack_28 != 0; vStack_28 = vStack_28 >> 1) {
      if ((vStack_28 & 1) != 0) {
        this = std::operator<<(out,' ');
        std::ostream::operator<<(this,b._4_4_ * 0x40 + local_2c);
      }
      local_2c = local_2c + 1;
    }
    b._4_4_ = b._4_4_ + 1;
  }
  std::operator<<(out,"}");
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const BitVector& bv) {
  out << "{";
  for (uint32_t i = 0; i < bv.bits_.size(); ++i) {
    BitVector::BitContainer b = bv.bits_[i];
    uint32_t j = 0;
    while (b != 0) {
      if (b & 1) {
        out << ' ' << i * BitVector::kBitContainerSize + j;
      }
      ++j;
      b = b >> 1;
    }
  }
  out << "}";
  return out;
}